

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O3

void WebRates(sunrealtype x,sunrealtype y,sunrealtype t,sunrealtype *c,sunrealtype *rate,
             WebData wdata)

{
  int iVar1;
  long lVar2;
  sunrealtype *psVar3;
  long lVar4;
  long lVar5;
  sunrealtype (*pasVar6) [6];
  
  iVar1 = wdata->ns;
  lVar5 = (long)iVar1;
  if (0 < lVar5) {
    pasVar6 = wdata->acoef;
    lVar4 = 0;
    memset(rate,0,lVar5 * 8);
    do {
      lVar2 = 0;
      psVar3 = rate;
      do {
        *psVar3 = c[lVar4] * (*pasVar6)[lVar2] + *psVar3;
        psVar3 = psVar3 + 1;
        lVar2 = lVar2 + 6;
      } while (lVar5 * 6 != lVar2);
      lVar4 = lVar4 + 1;
      pasVar6 = (sunrealtype (*) [6])(*pasVar6 + 1);
    } while (lVar4 != lVar5);
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        rate[lVar4] = (wdata->bcoef[lVar4] * (x * y + 1.0) + rate[lVar4]) * c[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
  }
  return;
}

Assistant:

static void WebRates(sunrealtype x, sunrealtype y, sunrealtype t,
                     sunrealtype c[], sunrealtype rate[], WebData wdata)
{
  int i, j, ns;
  sunrealtype fac, *bcoef;
  sunrealtype(*acoef)[NS];

  ns    = wdata->ns;
  acoef = wdata->acoef;
  bcoef = wdata->bcoef;

  for (i = 0; i < ns; i++) { rate[i] = ZERO; }

  for (j = 0; j < ns; j++)
  {
    for (i = 0; i < ns; i++) { rate[i] += c[j] * acoef[i][j]; }
  }

  fac = ONE + ALPHA * x * y;
  for (i = 0; i < ns; i++) { rate[i] = c[i] * (bcoef[i] * fac + rate[i]); }
}